

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O1

uint8_t * tlv_get_type_length(uint8_t *buf,size_t buflen,uint32_t *type,uint32_t *length)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t *puVar3;
  
  sVar1 = tlv_get_tlvar(buf,buflen,type);
  if (sVar1 == 0) {
    puVar3 = (uint8_t *)0x0;
  }
  else {
    sVar2 = tlv_get_tlvar(buf + sVar1,buflen - sVar1,length);
    puVar3 = buf + sVar1 + sVar2;
    if (sVar2 == 0) {
      puVar3 = (uint8_t *)0x0;
    }
  }
  return puVar3;
}

Assistant:

uint8_t*
tlv_get_type_length(uint8_t* buf, size_t buflen, uint32_t* type, uint32_t* length){
  uint32_t siz;
  uint8_t* ptr = buf;

  siz = tlv_get_tlvar(ptr, buflen, type);
  ptr += siz;
  buflen -= siz;
  if(siz == 0){
    return NULL;
  }

  siz = tlv_get_tlvar(ptr, buflen, length);
  ptr += siz;
  buflen -= siz;
  if(siz == 0){
    return NULL;
  }

  return ptr;
}